

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

qint64 __thiscall QDateTime::daysTo(QDateTime *this,QDateTime *other)

{
  QDate QVar1;
  QDate QVar2;
  long lVar3;
  
  QVar1 = date(this);
  QVar2 = date(other);
  lVar3 = QVar2.jd - QVar1.jd;
  if (QVar2.jd - 0xb69f248055U < 0xfffffe92c1eb868c) {
    lVar3 = 0;
  }
  if (QVar1.jd - 0xb69f248055U < 0xfffffe92c1eb868c) {
    lVar3 = 0;
  }
  return lVar3;
}

Assistant:

qint64 QDateTime::daysTo(const QDateTime &other) const
{
    return date().daysTo(other.date());
}